

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.hpp
# Opt level: O1

double __thiscall lightconf::scanner::expect_number(scanner *this)

{
  undefined8 *puVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  pointer ptVar7;
  undefined4 uVar9;
  pointer pcVar8;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  token_type tVar14;
  double dVar15;
  undefined4 uVar16;
  int iVar17;
  long *plVar18;
  undefined8 *puVar19;
  runtime_error *this_00;
  long *plVar20;
  ulong *puVar21;
  token *extraout_RDX;
  token *extraout_RDX_00;
  token *extraout_RDX_01;
  token *extraout_RDX_02;
  token *ptVar22;
  ulong uVar23;
  ulong uVar24;
  undefined8 uVar25;
  token tok;
  token tok_2;
  token tok_1;
  token tok_3;
  token_type local_1d0 [2];
  undefined1 *local_1c8;
  undefined8 local_1c0;
  undefined1 local_1b8 [16];
  double local_1a8;
  uint uStack_1a0;
  undefined4 uStack_19c;
  undefined4 uStack_198;
  undefined4 uStack_194;
  undefined8 *local_190;
  undefined8 local_188;
  undefined8 local_180;
  undefined4 uStack_178;
  undefined4 uStack_174;
  string local_170;
  ulong *local_150;
  token *local_148;
  ulong local_140;
  undefined4 uStack_138;
  undefined4 uStack_134;
  token_type local_130;
  undefined1 *local_128;
  undefined8 local_120;
  undefined1 local_118 [16];
  double local_108;
  uint uStack_100;
  int iStack_fc;
  undefined4 uStack_f8;
  undefined4 local_f4;
  token_type local_f0 [2];
  undefined1 *local_e8;
  undefined8 local_e0;
  undefined1 local_d8 [16];
  double local_c8;
  uint uStack_c0;
  undefined4 uStack_bc;
  undefined4 uStack_b8;
  undefined4 local_b4;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  token_type local_90;
  undefined1 *local_88;
  undefined8 local_80;
  undefined1 local_78 [16];
  double local_68;
  uint uStack_60;
  int iStack_5c;
  undefined4 uStack_58;
  undefined4 local_54;
  string local_50;
  
  skip_whitespace(this,false);
  uVar23 = (ulong)this->cur_token_;
  ptVar7 = (this->tokens_).super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>.
           _M_impl.super__Vector_impl_data._M_start;
  local_1c8 = local_1b8;
  if ((long)(this->tokens_).super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>.
            _M_impl.super__Vector_impl_data._M_finish - (long)ptVar7 >> 6 == uVar23) {
    local_1c0 = 0;
    local_1b8[0] = 0;
    local_1a8 = 0.0;
    uStack_1a0 = uStack_1a0 & 0xffffff00;
    uStack_19c = 0;
    uStack_198 = 0;
    uStack_194 = 0;
    local_1d0[0] = eof_token;
    ptVar22 = extraout_RDX;
  }
  else {
    local_1d0[0] = ptVar7[uVar23].type;
    pcVar8 = ptVar7[uVar23].string_value._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1c8,pcVar8,pcVar8 + ptVar7[uVar23].string_value._M_string_length);
    uVar2 = ptVar7[uVar23].line;
    uVar9 = ptVar7[uVar23].col;
    local_1a8 = ptVar7[uVar23].number_value;
    uVar25 = (&ptVar7[uVar23].number_value)[1];
    uStack_1a0 = (uint)uVar25;
    uStack_19c = (undefined4)((ulong)uVar25 >> 0x20);
    ptVar22 = extraout_RDX_00;
    uStack_198 = uVar2;
    uStack_194 = uVar9;
  }
  tVar14 = local_1d0[0];
  if (local_1c8 != local_1b8) {
    operator_delete(local_1c8);
    ptVar22 = extraout_RDX_01;
  }
  if (tVar14 == number_token) {
    uVar23 = (ulong)this->cur_token_;
    ptVar7 = (this->tokens_).super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((long)(this->tokens_).
              super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>._M_impl.
              super__Vector_impl_data._M_finish - (long)ptVar7 >> 6 == uVar23) {
      local_1c0 = 0;
      local_1b8[0] = 0;
      local_1a8 = 0.0;
      uStack_1a0 = (uint)uStack_1a0._1_3_ << 8;
      uStack_19c = 0;
      uStack_198 = 0;
      uStack_194 = 0;
      local_1d0[0] = eof_token;
      local_1c8 = local_1b8;
    }
    else {
      local_1d0[0] = ptVar7[uVar23].type;
      pcVar8 = ptVar7[uVar23].string_value._M_dataplus._M_p;
      local_1c8 = local_1b8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1c8,pcVar8,pcVar8 + ptVar7[uVar23].string_value._M_string_length);
      uVar3 = ptVar7[uVar23].line;
      uVar10 = ptVar7[uVar23].col;
      local_1a8 = ptVar7[uVar23].number_value;
      uVar25 = (&ptVar7[uVar23].number_value)[1];
      uStack_1a0 = (uint)uVar25;
      uStack_19c = (undefined4)((ulong)uVar25 >> 0x20);
      uStack_198 = uVar3;
      uStack_194 = uVar10;
    }
    dVar15 = local_1a8;
    if (local_1c8 != local_1b8) {
      operator_delete(local_1c8);
    }
    if ((ulong)this->cur_token_ <=
        ((long)(this->tokens_).
               super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>._M_impl.
               super__Vector_impl_data._M_finish -
         (long)(this->tokens_).
               super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>._M_impl.
               super__Vector_impl_data._M_start >> 6) - 1U) {
      this->cur_token_ = this->cur_token_ + 1;
    }
    return dVar15;
  }
  local_1d0[0] = 3;
  local_1c0 = 0;
  local_1b8[0] = 0;
  local_1a8 = 0.0;
  uStack_1a0 = (uint)uStack_1a0._1_3_ << 8;
  uStack_19c = 0;
  uStack_198 = 0;
  uStack_194 = 0;
  local_1c8 = local_1b8;
  token_name_abi_cxx11_(&local_50,(lightconf *)local_1d0,ptVar22);
  plVar18 = (long *)std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0x11a82b);
  local_b0 = (long *)*plVar18;
  plVar20 = plVar18 + 2;
  if (local_b0 == plVar20) {
    local_a0 = *plVar20;
    lStack_98 = plVar18[3];
    local_b0 = &local_a0;
  }
  else {
    local_a0 = *plVar20;
  }
  local_a8 = plVar18[1];
  *plVar18 = (long)plVar20;
  plVar18[1] = 0;
  *(undefined1 *)(plVar18 + 2) = 0;
  plVar18 = (long *)std::__cxx11::string::append((char *)&local_b0);
  local_150 = (ulong *)*plVar18;
  puVar21 = (ulong *)(plVar18 + 2);
  if (local_150 == puVar21) {
    local_140 = *puVar21;
    uStack_138 = (undefined4)plVar18[3];
    uStack_134 = *(undefined4 *)((long)plVar18 + 0x1c);
    local_150 = &local_140;
  }
  else {
    local_140 = *puVar21;
  }
  ptVar22 = (token *)plVar18[1];
  *plVar18 = (long)puVar21;
  plVar18[1] = 0;
  *(undefined1 *)(plVar18 + 2) = 0;
  uVar23 = (ulong)this->cur_token_;
  ptVar7 = (this->tokens_).super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>.
           _M_impl.super__Vector_impl_data._M_start;
  local_148 = ptVar22;
  if ((long)(this->tokens_).super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>.
            _M_impl.super__Vector_impl_data._M_finish - (long)ptVar7 >> 6 == uVar23) {
    local_e8 = local_d8;
    local_e0 = 0;
    local_d8[0] = 0;
    local_c8 = 0.0;
    uStack_c0 = uStack_c0 & 0xffffff00;
    uStack_bc = 0;
    uStack_b8 = 0;
    local_b4 = 0;
    local_f0[0] = eof_token;
  }
  else {
    local_f0[0] = ptVar7[uVar23].type;
    local_e8 = local_d8;
    pcVar8 = ptVar7[uVar23].string_value._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_e8,pcVar8,pcVar8 + ptVar7[uVar23].string_value._M_string_length);
    uVar4 = ptVar7[uVar23].line;
    uVar11 = ptVar7[uVar23].col;
    local_c8 = ptVar7[uVar23].number_value;
    ptVar7 = ptVar7 + uVar23;
    uVar25._0_1_ = ptVar7->char_value;
    uVar25._1_3_ = *(undefined3 *)&ptVar7->field_0x31;
    uVar25._4_4_ = ptVar7->pos;
    uStack_c0 = (uint)uVar25;
    ptVar22 = extraout_RDX_02;
    uStack_bc = uVar25._4_4_;
    uStack_b8 = uVar4;
    local_b4 = uVar11;
  }
  token_name_abi_cxx11_(&local_170,(lightconf *)local_f0,ptVar22);
  uVar23 = (long)&local_148->type + local_170._M_string_length;
  uVar24 = 0xf;
  if (local_150 != &local_140) {
    uVar24 = local_140;
  }
  if (uVar24 < uVar23) {
    uVar25 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != &local_170.field_2) {
      uVar25 = local_170.field_2._M_allocated_capacity;
    }
    if (uVar23 <= (ulong)uVar25) {
      puVar19 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_170,0,(char *)0x0,(ulong)local_150);
      goto LAB_00110c35;
    }
  }
  puVar19 = (undefined8 *)
            std::__cxx11::string::_M_append((char *)&local_150,(ulong)local_170._M_dataplus._M_p);
LAB_00110c35:
  local_190 = (undefined8 *)*puVar19;
  puVar1 = puVar19 + 2;
  if (local_190 == puVar1) {
    local_180 = *puVar1;
    uStack_178 = *(undefined4 *)(puVar19 + 3);
    uStack_174 = *(undefined4 *)((long)puVar19 + 0x1c);
    local_190 = &local_180;
  }
  else {
    local_180 = *puVar1;
  }
  local_188 = puVar19[1];
  *puVar19 = puVar1;
  puVar19[1] = 0;
  *(undefined1 *)puVar1 = 0;
  uVar23 = (ulong)this->cur_token_;
  ptVar7 = (this->tokens_).super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((long)(this->tokens_).super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>.
            _M_impl.super__Vector_impl_data._M_finish - (long)ptVar7 >> 6 == uVar23) {
    local_128 = local_118;
    local_120 = 0;
    local_118[0] = 0;
    local_108 = 0.0;
    uStack_100 = uStack_100 & 0xffffff00;
    iStack_fc = 0;
    uStack_f8 = 0;
    local_f4 = 0;
    local_130 = eof_token;
  }
  else {
    local_130 = ptVar7[uVar23].type;
    local_128 = local_118;
    pcVar8 = ptVar7[uVar23].string_value._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_128,pcVar8,pcVar8 + ptVar7[uVar23].string_value._M_string_length);
    uVar5 = ptVar7[uVar23].line;
    uVar12 = ptVar7[uVar23].col;
    local_108 = ptVar7[uVar23].number_value;
    uStack_100 = *(uint *)&ptVar7[uVar23].char_value;
    iStack_fc = ptVar7[uVar23].pos;
    uStack_f8 = uVar5;
    local_f4 = uVar12;
  }
  uVar16 = uStack_f8;
  uVar23 = (ulong)this->cur_token_;
  ptVar7 = (this->tokens_).super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((long)(this->tokens_).super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>.
            _M_impl.super__Vector_impl_data._M_finish - (long)ptVar7 >> 6 == uVar23) {
    local_88 = local_78;
    local_80 = 0;
    local_78[0] = 0;
    local_68 = 0.0;
    uStack_60 = uStack_60 & 0xffffff00;
    iStack_5c = 0;
    uStack_58 = 0;
    local_54 = 0;
    local_90 = eof_token;
  }
  else {
    local_90 = ptVar7[uVar23].type;
    local_88 = local_78;
    pcVar8 = ptVar7[uVar23].string_value._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_88,pcVar8,pcVar8 + ptVar7[uVar23].string_value._M_string_length);
    uVar6 = ptVar7[uVar23].line;
    uVar13 = ptVar7[uVar23].col;
    local_68 = ptVar7[uVar23].number_value;
    uStack_60 = *(uint *)&ptVar7[uVar23].char_value;
    iStack_5c = ptVar7[uVar23].pos;
    uStack_58 = uVar6;
    local_54 = uVar13;
  }
  iVar17 = iStack_5c;
  this_00 = (runtime_error *)__cxa_allocate_exception(0x18);
  std::runtime_error::runtime_error(this_00,(string *)&local_190);
  *(undefined ***)this_00 = &PTR__runtime_error_00120cb8;
  *(undefined4 *)(this_00 + 0x10) = uVar16;
  *(int *)(this_00 + 0x14) = iVar17;
  __cxa_throw(this_00,&parse_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

inline double scanner::expect_number() {
    skip_whitespace(false);
    if (cur_token().type != token_type::number_token) {
        fail("expected " + token_name(token(token_type::number_token)) + " but found " + token_name(cur_token()),
            cur_token().line, cur_token().pos);
    }
    double val = cur_token().number_value;
    next_token();
    return val;
}